

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
__thiscall kj::anon_unknown_36::NetworkAddressHttpClient::getClient(NetworkAddressHttpClient *this)

{
  HttpHeaderTable *params;
  bool bVar1;
  NetworkAddress *pNVar2;
  Own<kj::AsyncIoStream,_std::nullptr_t> *params_1;
  reference t;
  Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t> *pOVar3;
  HttpClientImpl *this_00;
  RefcountedClient *extraout_RDX;
  RefcountedClient *extraout_RDX_00;
  RefcountedClient *pRVar4;
  NetworkAddressHttpClient *in_RSI;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t> OVar5;
  undefined1 local_60 [8];
  Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t> client;
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> local_30;
  undefined1 local_28 [8];
  Own<kj::AsyncIoStream,_std::nullptr_t> stream;
  NetworkAddressHttpClient *this_local;
  
  do {
    bVar1 = std::
            deque<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
            ::empty(&in_RSI->availableClients);
    if (bVar1) {
      pNVar2 = Own<kj::NetworkAddress,_std::nullptr_t>::operator->(&in_RSI->address);
      (**pNVar2->_vptr_NetworkAddress)();
      newPromisedStream((kj *)local_28,&local_30);
      Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::~Promise(&local_30);
      params = in_RSI->responseHeaderTable;
      params_1 = mv<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
                           ((Own<kj::AsyncIoStream,_std::nullptr_t> *)local_28);
      heap<kj::(anonymous_namespace)::HttpClientImpl,kj::HttpHeaderTable_const&,kj::Own<kj::AsyncIoStream,decltype(nullptr)>,kj::HttpClientSettings&>
                ((kj *)&client.ptr,params,params_1,&in_RSI->settings);
      refcounted<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,kj::(anonymous_namespace)::NetworkAddressHttpClient&,kj::Own<kj::(anonymous_namespace)::HttpClientImpl,decltype(nullptr)>>
                ((kj *)this,in_RSI,
                 (Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t> *)&client.ptr);
      Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t>::~Own
                ((Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t> *)&client.ptr);
      Own<kj::AsyncIoStream,_std::nullptr_t>::~Own
                ((Own<kj::AsyncIoStream,_std::nullptr_t> *)local_28);
      pRVar4 = extraout_RDX;
      break;
    }
    t = std::
        deque<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
        ::back(&in_RSI->availableClients);
    pOVar3 = mv<kj::Own<kj::(anonymous_namespace)::HttpClientImpl,decltype(nullptr)>>(&t->client);
    Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t>::Own
              ((Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t> *)local_60,pOVar3);
    std::
    deque<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
    ::pop_back(&in_RSI->availableClients);
    this_00 = Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t>::operator->
                        ((Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t> *)local_60)
    ;
    bVar1 = HttpClientImpl::canReuse(this_00);
    if (bVar1) {
      pOVar3 = mv<kj::Own<kj::(anonymous_namespace)::HttpClientImpl,decltype(nullptr)>>
                         ((Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t> *)local_60
                         );
      refcounted<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,kj::(anonymous_namespace)::NetworkAddressHttpClient&,kj::Own<kj::(anonymous_namespace)::HttpClientImpl,decltype(nullptr)>>
                ((kj *)this,in_RSI,pOVar3);
    }
    Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t>::~Own
              ((Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t> *)local_60);
    pRVar4 = extraout_RDX_00;
  } while (!bVar1);
  OVar5.ptr = pRVar4;
  OVar5.disposer = (Disposer *)this;
  return OVar5;
}

Assistant:

kj::Own<RefcountedClient> getClient() {
    for (;;) {
      if (availableClients.empty()) {
        auto stream = newPromisedStream(address->connect());
        return kj::refcounted<RefcountedClient>(*this,
          kj::heap<HttpClientImpl>(responseHeaderTable, kj::mv(stream), settings));
      } else {
        auto client = kj::mv(availableClients.back().client);
        availableClients.pop_back();
        if (client->canReuse()) {
          return kj::refcounted<RefcountedClient>(*this, kj::mv(client));
        }
        // Whoops, this client's connection was closed by the server at some point. Discard.
      }
    }
  }